

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O3

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec,HalDecTask *task)

{
  Avs2dFrameMgr_t *mgr;
  undefined4 uVar1;
  undefined4 uVar2;
  RK_U8 RVar3;
  uint uVar4;
  int iVar5;
  Avs2dPicType AVar6;
  MppFrame s;
  byte bVar7;
  int iVar8;
  MppFrameFormat MVar9;
  MPP_RET MVar10;
  RK_S64 RVar11;
  Avs2dFrame_t *pAVar12;
  int iVar13;
  Avs2dFrame_t **ppAVar14;
  char *fname;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  char *fmt;
  RK_U32 RVar18;
  uint uVar19;
  undefined8 uVar20;
  Avs2dFrame_t *pAVar21;
  uint uVar22;
  bool bVar23;
  
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","avs2d_dpb_insert");
  }
  mgr = &p_dec->frm_mgr;
  if ((p_dec->frm_mgr).output_poi != -1) {
    iVar13 = (p_dec->frm_mgr).prev_doi;
    uVar22 = iVar13 + 0x100;
    if (-1 < (int)(iVar13 + 1U)) {
      uVar22 = iVar13 + 1U;
    }
    if ((p_dec->ph).doi != (iVar13 - (uVar22 & 0xffffff00)) + 1) {
      if ((avs2d_parse_debug & 4) != 0) {
        _mpp_log_l(4,"avs2d_dpb","discontinuous DOI (prev: %d --> curr: %d).",(char *)0x0);
      }
      uVar22 = mgr->dpb_size;
      if ((ulong)uVar22 != 0) {
        ppAVar14 = (p_dec->frm_mgr).dpb;
        uVar15 = 0;
        do {
          pAVar21 = ppAVar14[uVar15];
          if (pAVar21->slot_idx != -1) {
            uVar4 = pAVar21->doi;
            uVar19 = uVar4 + 0xff;
            if (-1 < (int)uVar4) {
              uVar19 = uVar4;
            }
            uVar19 = ((uVar19 & 0xffffff00) - uVar4) + (p_dec->ph).doi;
            uVar4 = -uVar19;
            if (0 < (int)uVar19) {
              uVar4 = uVar19;
            }
            if (1 < uVar4) {
              pAVar21->refered_by_others = '\0';
              pAVar21->refered_by_scene = '\0';
            }
          }
          uVar15 = uVar15 + 1;
        } while (uVar22 != uVar15);
      }
    }
  }
  iVar8 = (p_dec->ph).doi;
  iVar13 = (p_dec->frm_mgr).tr_wrap_cnt;
  if (iVar8 < (p_dec->frm_mgr).prev_doi) {
    iVar13 = iVar13 + 1;
    (p_dec->frm_mgr).tr_wrap_cnt = iVar13;
  }
  (p_dec->frm_mgr).prev_doi = iVar8;
  iVar8 = iVar8 + iVar13 * 0x100;
  (p_dec->ph).doi = iVar8;
  if (0x7ffffdfe < iVar8) {
    iVar13 = iVar13 * 0x100 + -0x100;
    uVar22 = mgr->dpb_size;
    if ((ulong)uVar22 != 0) {
      ppAVar14 = (p_dec->frm_mgr).dpb;
      uVar15 = 0;
      do {
        pAVar21 = ppAVar14[uVar15];
        if (pAVar21->slot_idx != -1) {
          uVar1 = pAVar21->doi;
          uVar2 = pAVar21->poi;
          pAVar21->doi = uVar1 - iVar13;
          pAVar21->poi = uVar2 - iVar13;
        }
        uVar15 = uVar15 + 1;
      } while (uVar22 != uVar15);
    }
    iVar8 = iVar8 - iVar13;
    (p_dec->ph).doi = iVar8;
    iVar5 = (p_dec->frm_mgr).output_poi;
    if (iVar5 != -1) {
      (p_dec->frm_mgr).output_poi = iVar5 - iVar13;
    }
  }
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","low_delay %d, reorder_delay %d\n","compute_frame_order_index",
               (ulong)(p_dec->vsh).low_delay,(ulong)(p_dec->vsh).picture_reorder_delay);
    iVar8 = (p_dec->ph).doi;
  }
  iVar13 = iVar8;
  if ((p_dec->vsh).low_delay == '\0') {
    iVar13 = ((uint)(p_dec->ph).picture_output_delay + iVar8) -
             (uint)(p_dec->vsh).picture_reorder_delay;
  }
  (p_dec->ph).poi = iVar13;
  if (((iVar8 < 0) || (iVar13 < 0)) &&
     (_mpp_log_l(2,"avs2d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "ph->doi >= 0 && ph->poi >= 0","compute_frame_order_index",0xf4),
     (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_00187b08;
  uVar22 = (p_dec->frm_mgr).output_poi;
  uVar15 = (ulong)uVar22;
  if ((uVar22 == 0xffffffff) && (uVar15 = 0xffffffff, (p_dec->ph).picture_type == I_PICTURE)) {
    uVar22 = (p_dec->ph).poi;
    uVar15 = (ulong)uVar22;
    (p_dec->frm_mgr).output_poi = uVar22;
  }
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","picuture DOI %d, POI %d, out_delay %d, output_poi %d\n",
               "compute_frame_order_index",(ulong)(uint)(p_dec->ph).doi,(ulong)(uint)(p_dec->ph).poi
               ,(ulong)(p_dec->ph).picture_output_delay,uVar15);
  }
  dpb_output_next_frame(p_dec,1);
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_remove_scene_frame");
  }
  if ((((p_dec->ph).picture_type & ~P_PICTURE) == G_PICTURE) &&
     (pAVar21 = (p_dec->frm_mgr).scene_ref, pAVar21 != (Avs2dFrame_t *)0x0)) {
    pAVar21->refered_by_scene = '\0';
    if (pAVar21->picture_type == GB_PICTURE) {
      dpb_remove_frame(p_dec,pAVar21);
    }
    (p_dec->frm_mgr).scene_ref = (Avs2dFrame_t *)0x0;
  }
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","dpb_remove_scene_frame");
  }
  dpb_remove_unused_frame(p_dec);
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_alloc_frame");
  }
  uVar15 = (ulong)(p_dec->frm_mgr).dpb_size;
  if ((p_dec->vsh).field_coded_sequence == '\0') {
    if (uVar15 == 0) goto LAB_00187111;
    ppAVar14 = (p_dec->frm_mgr).dpb;
LAB_00187083:
    lVar17 = 0;
    do {
      pAVar21 = ppAVar14[lVar17];
      if (pAVar21->slot_idx == -1) break;
      bVar23 = uVar15 - 1 != lVar17;
      lVar17 = lVar17 + 1;
    } while (bVar23);
    iVar13 = (p_dec->ph).poi;
LAB_001870a5:
    pAVar21->doi = (p_dec->ph).doi;
    pAVar21->poi = iVar13;
    pAVar21->out_delay = (uint)(p_dec->ph).picture_output_delay;
    AVar6 = (p_dec->ph).picture_type;
    bVar23 = AVar6 == G_PICTURE || AVar6 == GB_PICTURE;
    s = pAVar21->frame;
    pAVar21->picture_type = AVar6;
    pAVar21->invisible = AVar6 == GB_PICTURE;
    pAVar21->scene_frame_flag = bVar23;
    pAVar21->intra_frame_flag = AVar6 == I_PICTURE || (AVar6 & ~P_PICTURE) == G_PICTURE;
    pAVar21->refered_by_scene = bVar23;
    if (AVar6 == GB_PICTURE) {
      bVar23 = false;
    }
    else {
      bVar23 = (p_dec->frm_mgr).cur_rps.refered_by_others != '\0';
    }
    pAVar21->refered_by_others = bVar23;
    if ((avs2d_parse_debug & 0x40) != 0) {
      _mpp_log_l(4,"avs2d_dpb","frame picture type %d, ref by others %d\n","dpb_alloc_frame",
                 (ulong)AVar6,(ulong)bVar23);
    }
    if ((p_dec->vsh).chroma_format == '\x01') {
      RVar3 = (p_dec->vsh).bit_depth;
      if (RVar3 == '\b') {
        MVar9 = MPP_FMT_YUV420SP;
      }
      else {
        if (RVar3 != '\n') goto LAB_00187192;
        MVar9 = MPP_FMT_YUV420SP_10BIT;
      }
      mpp_frame_set_fmt(s,MVar9);
    }
LAB_00187192:
    MVar9 = (((p_dec->init).cfg)->base).out_fmt;
    if ((MVar9 & 0xf00000) == MPP_FMT_YUV420SP) {
      if ((MVar9 >> 0x19 & 1) != 0) {
        MVar9 = mpp_frame_get_fmt(s);
        mpp_frame_set_fmt(s,(((p_dec->init).cfg)->base).out_fmt & 0x2000000 | MVar9);
      }
    }
    else {
      RVar18 = (p_dec->vsh).horizontal_size;
      MVar9 = mpp_frame_get_fmt(s);
      mpp_frame_set_fmt(s,(((p_dec->init).cfg)->base).out_fmt & 0xf00000 | MVar9);
      if (*compat_ext_fbc_hdr_256_odd == 0) {
        RVar18 = RVar18 + 0x3f & 0xffffffc0;
      }
      else {
        RVar18 = (p_dec->vsh).horizontal_size + 0xff & 0xfffffe00 | 0x100;
      }
      mpp_frame_set_fbc_hdr_stride(s,RVar18);
      mpp_frame_set_offset_y(s,8);
    }
    if (p_dec->is_hdr != 0) {
      MVar9 = mpp_frame_get_fmt(s);
      mpp_frame_set_fmt(s,MVar9 | 0x4000000);
    }
    RVar18 = (((p_dec->init).cfg)->base).enable_thumbnail;
    if ((RVar18 == 0) || ((((p_dec->init).hw_info)->field_0x6 & 8) == 0)) {
      RVar18 = 0;
    }
    mpp_frame_set_thumbnail_en(s,RVar18);
    mpp_frame_set_width(s,(p_dec->vsh).horizontal_size);
    mpp_frame_set_height(s,(p_dec->vsh).vertical_size);
    RVar11 = mpp_packet_get_pts(task->input_packet);
    mpp_frame_set_pts(s,RVar11);
    RVar11 = mpp_packet_get_dts(task->input_packet);
    mpp_frame_set_dts(s,RVar11);
    mpp_frame_set_errinfo(s,0);
    mpp_frame_set_discard(s,0);
    mpp_frame_set_poc(s,pAVar21->poi);
    if (p_dec->got_exh != 0) {
      mpp_frame_set_color_primaries(s,(p_dec->exh).color_primaries);
      mpp_frame_set_color_trc(s,(p_dec->exh).transfer_characteristics);
      mpp_frame_set_colorspace(s,(p_dec->exh).matrix_coefficients);
    }
    mpp_frame_set_content_light(s,p_dec->content_light);
    mpp_frame_set_mastering_display(s,p_dec->display_meta);
    if ((p_dec->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0) && (p_dec->hdr_dynamic != 0)) {
      mpp_frame_set_hdr_dynamic_meta(s,p_dec->hdr_dynamic_meta);
      p_dec->hdr_dynamic = 0;
    }
    if ((p_dec->vsh).progressive_sequence == '\0') {
      if ((p_dec->vsh).field_coded_sequence == '\0') {
        pAVar21->frame_coding_mode = 0;
        if ((p_dec->ph).top_field_first == '\0') {
          pAVar21->frame_mode = 0xb;
          goto LAB_00187402;
        }
        pAVar21->frame_mode = 7;
      }
      else {
        if ((p_dec->ph).top_field_first == '\0') {
          pAVar21->frame_mode = 0xb;
          pAVar21->frame_coding_mode = 0xb;
LAB_00187402:
          RVar18 = 0xb;
          goto LAB_00187407;
        }
        pAVar21->frame_mode = 7;
        pAVar21->frame_coding_mode = 7;
      }
      RVar18 = 7;
    }
    else {
      pAVar21->frame_mode = 0;
      pAVar21->frame_coding_mode = 0;
      RVar18 = 0;
      if (((((p_dec->init).cfg)->base).enable_vproc & 2) != 0) {
        pAVar21->frame_mode = 0xc;
        RVar18 = 0xc;
      }
    }
LAB_00187407:
    mpp_frame_set_mode(s,RVar18);
    MVar10 = mpp_buf_slot_get_unused(p_dec->frame_slots,&pAVar21->slot_idx);
    if ((MVar10 != MPP_OK) &&
       (_mpp_log_l(2,"avs2d_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                   "dpb_alloc_frame",0x23b), (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_00187b08:
      abort();
    }
    (p_dec->frm_mgr).used_size = (p_dec->frm_mgr).used_size + 1;
    if (((avs2d_parse_debug & 0x40) != 0) &&
       (_mpp_log_l(4,"avs2d_dpb","get unused buf slot %d, DPB used %d \n","dpb_alloc_frame",
                   (ulong)(uint)pAVar21->slot_idx), (avs2d_parse_debug & 0x40) != 0)) {
      fmt = "Out.";
      fname = "dpb_alloc_frame";
      iVar13 = 4;
      goto LAB_001874c5;
    }
  }
  else {
    if (uVar15 != 0) {
      ppAVar14 = (p_dec->frm_mgr).dpb;
      uVar16 = 0;
      do {
        pAVar21 = ppAVar14[uVar16];
        if ((pAVar21->slot_idx != -1) && (iVar13 = pAVar21->poi, iVar13 == (p_dec->ph).poi))
        goto LAB_001870a5;
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
      goto LAB_00187083;
    }
LAB_00187111:
    fmt = "Failed to get dpb buffer.\n";
    pAVar21 = (Avs2dFrame_t *)0x0;
    iVar13 = 2;
    fname = (char *)0x0;
LAB_001874c5:
    _mpp_log_l(iVar13,"avs2d_dpb",fmt,fname);
  }
  p_dec->frame_no = p_dec->frame_no + 1;
  if ((avs2d_parse_debug & 0x40) == 0) {
    if (pAVar21 == (Avs2dFrame_t *)0x0) {
      _mpp_log_l(2,"avs2d_dpb","Failed to alloc dpb frame.\n",(char *)0x0);
      MVar10 = MPP_ERR_NOMEM;
      goto LAB_00187a82;
    }
  }
  else {
    _mpp_log_l(4,"avs2d_dpb","get unused frame from dpb %d","avs2d_dpb_insert",
               (ulong)(uint)pAVar21->slot_idx);
  }
  (p_dec->frm_mgr).cur_frm = pAVar21;
  mpp_buf_slot_set_prop(p_dec->frame_slots,pAVar21->slot_idx,SLOT_FRAME,pAVar21->frame);
  mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar21->slot_idx,SLOT_CODEC_USE);
  mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar21->slot_idx,SLOT_HAL_OUTPUT);
  task->output = ((p_dec->frm_mgr).cur_frm)->slot_idx;
  if (((avs2d_parse_debug & 0x40) != 0) &&
     (_mpp_log_l(4,"avs2d_dpb","curframe slot_idx %d\n","avs2d_dpb_insert"),
     (avs2d_parse_debug & 0x40) != 0)) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_set_frame_refs");
  }
  (p_dec->frm_mgr).refs[4] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[5] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[2] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[3] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[0] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[1] = (Avs2dFrame_t *)0x0;
  (p_dec->frm_mgr).refs[6] = (Avs2dFrame_t *)0x0;
  pAVar21 = (p_dec->frm_mgr).cur_frm;
  (p_dec->frm_mgr).num_of_ref = '\0';
  uVar15 = (ulong)(p_dec->frm_mgr).cur_rps.num_of_ref;
  (task->flags).val = (task->flags).val & 0xffffffffff0000ff;
  if (uVar15 == 0) {
    bVar7 = (p_dec->frm_mgr).num_of_ref;
  }
  else {
    uVar16 = 0;
    do {
      uVar22 = pAVar21->doi - (uint)(p_dec->frm_mgr).cur_rps.ref_pic[uVar16];
      pAVar12 = find_ref_frame(mgr,uVar22);
      if (pAVar12 == (Avs2dFrame_t *)0x0) {
        (task->flags).val =
             (task->flags).val & 0xffffffffff0000ff |
             (ulong)((0x100 << ((byte)uVar16 & 0x1f) | (uint)(task->flags).val) & 0xffff00);
        if ((avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","Missing ref doi %d","dpb_set_frame_refs",(ulong)uVar22);
        }
      }
      else {
        (p_dec->frm_mgr).refs[(p_dec->frm_mgr).num_of_ref] = pAVar12;
        mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar12->slot_idx,SLOT_CODEC_USE);
        mpp_buf_slot_set_flag(p_dec->frame_slots,pAVar12->slot_idx,SLOT_HAL_INPUT);
      }
      bVar7 = (p_dec->frm_mgr).num_of_ref + 1;
      (p_dec->frm_mgr).num_of_ref = bVar7;
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  ppAVar14 = (p_dec->frm_mgr).refs;
  if ((bVar7 == 0) && (pAVar21->intra_frame_flag == '\0')) {
LAB_001877e6:
    (p_dec->syntax).refp.scene_ref_enable = 0;
    mpp_frame_set_errinfo(pAVar21->frame,1);
    uVar20 = 0xffffffff;
    if ((avs2d_parse_debug & 1) == 0) {
      bVar23 = false;
    }
    else {
      bVar23 = false;
      _mpp_log_l(4,"avs2d_dpb","Error reference frame for picture(%d).\n",(char *)0x0,
                 (ulong)pAVar21->picture_type);
    }
  }
  else {
    switch(pAVar21->picture_type) {
    case P_PICTURE:
    case F_PICTURE:
      if ((p_dec->ph).background_reference_flag == '\0') {
        if (pAVar21->picture_type == B_PICTURE) goto switchD_00187720_caseD_2;
        break;
      }
      pAVar21->refered_bg_frame = '\x01';
      pAVar12 = (p_dec->frm_mgr).scene_ref;
      if (pAVar12 == (Avs2dFrame_t *)0x0) goto LAB_001877e6;
      iVar13 = bVar7 - 1;
LAB_00187744:
      (p_dec->syntax).refp.scene_ref_replace_pos = iVar13;
LAB_0018774a:
      (p_dec->syntax).refp.scene_ref_enable = 1;
      (p_dec->syntax).refp.scene_ref_slot_idx = pAVar12->slot_idx;
      goto LAB_001877e1;
    case B_PICTURE:
switchD_00187720_caseD_2:
      if (((bVar7 != 2) ||
          ((*ppAVar14 != (Avs2dFrame_t *)0x0 && ((*ppAVar14)->poi <= pAVar21->poi)))) ||
         ((pAVar12 = (p_dec->frm_mgr).refs[1], pAVar12 != (Avs2dFrame_t *)0x0 &&
          (pAVar21->poi <= pAVar12->poi)))) goto LAB_001877e6;
      break;
    case S_PICTURE:
      pAVar21->refered_bg_frame = '\x01';
      pAVar12 = (p_dec->frm_mgr).scene_ref;
      if (pAVar12 == (Avs2dFrame_t *)0x0) goto LAB_001877e6;
      pAVar21 = *ppAVar14;
      if (1 < bVar7 || pAVar12 != pAVar21) {
        iVar13 = 0;
        if ((avs2d_parse_debug & 1) == 0) goto LAB_00187744;
        if (pAVar21 == (Avs2dFrame_t *)0x0) {
          uVar15 = 0xffffffff;
        }
        else {
          uVar15 = (ulong)(uint)pAVar21->doi;
        }
        _mpp_log_l(4,"avs2d_dpb","Error reference frame(doi %ld ~ %ld) for S.\n",(char *)0x0,
                   (ulong)(uint)pAVar12->doi,uVar15);
        pAVar12 = (p_dec->frm_mgr).scene_ref;
        (p_dec->syntax).refp.scene_ref_replace_pos = 0;
        if (pAVar12 != (Avs2dFrame_t *)0x0) goto LAB_0018774a;
        (p_dec->syntax).refp.scene_ref_enable = 0;
        goto LAB_001877e1;
      }
    }
    (p_dec->syntax).refp.scene_ref_enable = 0;
LAB_001877e1:
    uVar20 = 0;
    bVar23 = true;
  }
  if ((avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out. ret %d","dpb_set_frame_refs",uVar20);
  }
  if (!bVar23) {
    *(byte *)&task->flags = *(byte *)&task->flags & 0xf7;
  }
  if ((p_dec->frm_mgr).num_of_ref != '\0') {
    uVar15 = 0;
    do {
      pAVar21 = ppAVar14[uVar15];
      if (pAVar21 == (Avs2dFrame_t *)0x0) {
        task->refer[uVar15] = -1;
        if ((avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","task refer[%d] missing ref\n","avs2d_dpb_insert",
                     uVar15 & 0xffffffff);
        }
      }
      else {
        uVar22 = pAVar21->slot_idx;
        task->refer[uVar15] = uVar22;
        if ((avs2d_parse_debug & 0x40) != 0) {
          _mpp_log_l(4,"avs2d_dpb","task refer[%d] slot_idx %d doi %d poi %d","avs2d_dpb_insert",
                     uVar15 & 0xffffffff,(ulong)uVar22,(ulong)(uint)pAVar21->doi,
                     (ulong)(uint)pAVar21->poi);
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (p_dec->frm_mgr).num_of_ref);
  }
  dpb_update_refs(p_dec);
  if (((avs2d_parse_debug & 0x40) != 0) &&
     (_mpp_log_l(4,"avs2d_dpb","--------DPB INFO--------","avs2d_dpb_insert"),
     (avs2d_parse_debug & 0x40) != 0)) {
    _mpp_log_l(4,"avs2d_dpb","dpb_idx slt_idx doi poi type out refered\n","avs2d_dpb_insert");
  }
  uVar22 = mgr->dpb_size;
  RVar18 = avs2d_parse_debug;
  if (uVar22 != 0) {
    uVar15 = 0;
    do {
      if ((RVar18 & 0x40) != 0) {
        pAVar21 = (p_dec->frm_mgr).dpb[uVar15];
        AVar6 = pAVar21->picture_type;
        if ((ulong)AVar6 < 6) {
          uVar16 = (ulong)*(uint *)(&DAT_00282480 + (ulong)AVar6 * 4);
        }
        else {
          uVar16 = 0x45;
          if (AVar6 == S_PICTURE) {
            uVar16 = 0x53;
          }
        }
        _mpp_log_l(4,"avs2d_dpb","%02d      %02d      %02d  %02d  %c    %d   %d","avs2d_dpb_insert",
                   uVar15 & 0xffffffff,(ulong)(uint)pAVar21->slot_idx,(ulong)(uint)pAVar21->doi,
                   (ulong)(uint)pAVar21->poi,uVar16,(ulong)pAVar21->is_output,
                   (ulong)(pAVar21->refered_by_scene | pAVar21->refered_by_others));
        uVar22 = mgr->dpb_size;
        RVar18 = avs2d_parse_debug;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar22);
  }
  if ((RVar18 & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","------------------------","avs2d_dpb_insert");
  }
  MVar10 = (MPP_RET)uVar20;
LAB_00187a82:
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","avs2d_dpb_insert");
  }
  return MVar10;
}

Assistant:

MPP_RET avs2d_dpb_insert(Avs2dCtx_t *p_dec, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i;
    Avs2dFrame_t *p;
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;

    AVS2D_PARSE_TRACE("In.");

    compute_frame_order_index(p_dec);

    //!< output frame from dpb
    dpb_output_next_frame(p_dec, 1);

    //!< remove scene(G/GB) frame(scene dbp has only one G/GB)
    dpb_remove_scene_frame(p_dec);

    //!< remove unused dpb frame
    dpb_remove_unused_frame(p_dec);

    //!< set task with new frame
    p = dpb_alloc_frame(p_dec, task);
    p_dec->frame_no++;
    avs2d_dbg_dpb("get unused frame from dpb %d", p->slot_idx);
    if (!p) {
        ret = MPP_ERR_NOMEM;
        mpp_err("Failed to alloc dpb frame.\n");
        goto __FAILED;
    }

    mgr->cur_frm = p;
    mpp_buf_slot_set_prop(p_dec->frame_slots, p->slot_idx, SLOT_FRAME, p->frame);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_CODEC_USE);
    mpp_buf_slot_set_flag(p_dec->frame_slots, p->slot_idx, SLOT_HAL_OUTPUT);

    //!< set task output
    task->output = mgr->cur_frm->slot_idx;
    avs2d_dbg_dpb("curframe slot_idx %d\n", mgr->cur_frm->slot_idx);

    //!< set task refers
    ret = dpb_set_frame_refs(p_dec, mgr, task);
    if (ret)
        task->flags.ref_err = 0;

    for (i = 0; i < mgr->num_of_ref; i++) {
        task->refer[i] = mgr->refs[i] ? mgr->refs[i]->slot_idx : -1;
        if (mgr->refs[i]) {
            task->refer[i] = mgr->refs[i]->slot_idx;
            avs2d_dbg_dpb("task refer[%d] slot_idx %d doi %d poi %d", i, task->refer[i], mgr->refs[i]->doi, mgr->refs[i]->poi);
        } else {
            task->refer[i] = -1;
            avs2d_dbg_dpb("task refer[%d] missing ref\n", i);
        }
    }

    //!< update dpb by rps
    dpb_update_refs(p_dec);

    avs2d_dbg_dpb("--------DPB INFO--------");
    avs2d_dbg_dpb("dpb_idx slt_idx doi poi type out refered\n");
    Avs2dFrame_t *tmp;
    for (i = 0; i < mgr->dpb_size; i++) {
        tmp = mgr->dpb[i];
        avs2d_dbg_dpb("%02d      %02d      %02d  %02d  %c    %d   %d",
                      i, tmp->slot_idx, tmp->doi, tmp->poi, PICTURE_TYPE_TO_CHAR(tmp->picture_type),
                      tmp->is_output, tmp->refered_by_others | tmp->refered_by_scene);
    }
    avs2d_dbg_dpb("------------------------");

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}